

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall
QCss::ValueExtractor::extractBox(ValueExtractor *this,int *margins,int *paddings,int *spacing)

{
  Property PVar1;
  Declaration *pDVar2;
  int iVar3;
  int *m;
  int i;
  ulong uVar4;
  long lVar5;
  Declaration *decl;
  bool bVar6;
  
  extractFont(this);
  lVar5 = 0;
  uVar4 = 0;
  bVar6 = false;
  do {
    if ((ulong)(this->declarations).d.size <= uVar4) {
      return bVar6;
    }
    pDVar2 = (this->declarations).d.ptr;
    decl = (Declaration *)((long)&(pDVar2->d).d.ptr + lVar5);
    PVar1 = (pDVar2[uVar4].d.d.ptr)->propertyId;
    switch(PVar1) {
    case Margin:
      m = margins;
LAB_0053f091:
      lengthValues(this,decl,m);
      break;
    case MarginBottom:
      iVar3 = lengthValue(this,decl);
      margins[2] = iVar3;
      break;
    case MarginLeft:
      iVar3 = lengthValue(this,decl);
      margins[3] = iVar3;
      break;
    case MarginRight:
      iVar3 = lengthValue(this,decl);
      margins[1] = iVar3;
      break;
    case MarginTop:
      iVar3 = lengthValue(this,decl);
      *margins = iVar3;
      break;
    default:
      switch(PVar1) {
      case Padding:
        m = paddings;
        goto LAB_0053f091;
      case PaddingLeft:
        iVar3 = lengthValue(this,decl);
        paddings[3] = iVar3;
        break;
      case PaddingRight:
        iVar3 = lengthValue(this,decl);
        paddings[1] = iVar3;
        break;
      case PaddingTop:
        iVar3 = lengthValue(this,decl);
        *paddings = iVar3;
        break;
      case PaddingBottom:
        iVar3 = lengthValue(this,decl);
        paddings[2] = iVar3;
        break;
      default:
        if ((PVar1 == QtSpacing) && (bVar6 = true, spacing != (int *)0x0)) {
          iVar3 = lengthValue(this,decl);
          *spacing = iVar3;
        }
        goto LAB_0053f138;
      }
    }
    bVar6 = true;
LAB_0053f138:
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

bool ValueExtractor::extractBox(int *margins, int *paddings, int *spacing)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case PaddingLeft: paddings[LeftEdge] = lengthValue(decl); break;
        case PaddingRight: paddings[RightEdge] = lengthValue(decl); break;
        case PaddingTop: paddings[TopEdge] = lengthValue(decl); break;
        case PaddingBottom: paddings[BottomEdge] = lengthValue(decl); break;
        case Padding: lengthValues(decl, paddings); break;

        case MarginLeft: margins[LeftEdge] = lengthValue(decl); break;
        case MarginRight: margins[RightEdge] = lengthValue(decl); break;
        case MarginTop: margins[TopEdge] = lengthValue(decl); break;
        case MarginBottom: margins[BottomEdge] = lengthValue(decl); break;
        case Margin: lengthValues(decl, margins); break;
        case QtSpacing: if (spacing) *spacing = lengthValue(decl); break;

        default: continue;
        }
        hit = true;
    }

    return hit;
}